

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

bool __thiscall
FxVMFunctionCall::CheckEmitCast
          (FxVMFunctionCall *this,VMFunctionBuilder *build,bool returnit,ExpEmit *reg)

{
  uint uVar1;
  uint uVar2;
  FxExpression *pFVar3;
  int iVar4;
  ExpEmit EVar5;
  ExpEmit reg_00;
  ExpEmit where;
  anon_union_8_3_addc324a_for_ExpVal_1 local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  uVar2 = *(uint *)&(this->Function->super_PSymbol).super_PTypeBase.super_DObject.field_0x24;
  uVar1 = uVar2 - 0x274;
  if (uVar1 < 3) {
    pFVar3 = *(this->ArgList).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    if (returnit) {
      iVar4 = (*pFVar3->_vptr_FxExpression[3])(pFVar3);
      if (((uVar2 & 0x276) == 0x274) && ((char)iVar4 != '\0')) {
        ExpVal::ExpVal((ExpVal *)&where,(ExpVal *)(pFVar3 + 1));
        VMFunctionBuilder::EmitRetInt(build,0,true,local_38.Int);
        EVar5.RegNum = 0;
        EVar5.RegType = 0x80;
        EVar5.RegCount = '\x01';
        EVar5.Konst = false;
        EVar5.Fixed = false;
        EVar5.Final = true;
        EVar5.Target = false;
        ExpVal::~ExpVal((ExpVal *)&where);
      }
      else {
        EVar5.RegNum = 0;
        EVar5.RegType = 0x80;
        EVar5.RegCount = '\x01';
        EVar5.Konst = false;
        EVar5.Fixed = false;
        EVar5.Final = true;
        EVar5.Target = false;
        reg_00._0_4_ = (*pFVar3->_vptr_FxExpression[9])(pFVar3,build);
        reg_00.Konst = (bool)(char)extraout_var_00;
        reg_00.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
        reg_00.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
        reg_00.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
        where = reg_00;
        iVar4 = EncodeRegType(reg_00);
        VMFunctionBuilder::Emit(build,0x4e,0x80,iVar4,reg_00._0_4_ & 0xffff);
        ExpEmit::Free(&where,build);
      }
    }
    else {
      EVar5._0_4_ = (*pFVar3->_vptr_FxExpression[9])(pFVar3,build);
      EVar5.Konst = (bool)(char)extraout_var;
      EVar5.Fixed = (bool)(char)((uint)extraout_var >> 8);
      EVar5.Final = (bool)(char)((uint)extraout_var >> 0x10);
      EVar5.Target = (bool)(char)((uint)extraout_var >> 0x18);
    }
    *reg = EVar5;
  }
  return uVar1 < 3;
}

Assistant:

bool FxVMFunctionCall::CheckEmitCast(VMFunctionBuilder *build, bool returnit, ExpEmit &reg)
{
	FName funcname = Function->SymbolName;
	if (funcname == NAME___decorate_internal_int__ ||
		funcname == NAME___decorate_internal_bool__ ||
		funcname == NAME___decorate_internal_float__)
	{
		FxExpression *arg = ArgList[0];
		if (returnit)
		{
			if (arg->isConstant() &&
				(funcname == NAME___decorate_internal_int__ ||
				 funcname == NAME___decorate_internal_bool__))
			{ // Use immediate version for integers in range
				build->EmitRetInt(0, true, static_cast<FxConstant *>(arg)->GetValue().Int);
			}
			else
			{
				ExpEmit where = arg->Emit(build);
				build->Emit(OP_RET, RET_FINAL, EncodeRegType(where), where.RegNum);
				where.Free(build);
			}
			reg = ExpEmit();
			reg.Final = true;
		}
		else
		{
			reg = arg->Emit(build);
		}
		return true;
	}
	return false;
}